

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Screen_Manager::~Screen_Manager(Screen_Manager *this)

{
  Screen_Info *pSVar1;
  Screen_Info *next_screen;
  Screen_Info *screen;
  Screen_Manager *this_local;
  
  if (this->head != (Screen_Info *)0x0) {
    next_screen = this->head;
    do {
      pSVar1 = next_screen->next;
      if (next_screen != (Screen_Info *)0x0) {
        Screen_Info::~Screen_Info(next_screen);
        operator_delete(next_screen);
      }
      next_screen = pSVar1;
    } while (pSVar1 != this->head);
  }
  return;
}

Assistant:

Screen_Manager::~Screen_Manager()
{
  if (head != nullptr) {
    Screen_Info *screen = head;
    do {
      Screen_Info *next_screen = screen->next;
      delete screen;
      screen = next_screen;
    } while (screen != head);
  }
}